

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O0

void __thiscall TcpServer::daemonRun(TcpServer *this)

{
  bool bVar1;
  char *__args_1;
  unsigned_long __args_2;
  mapped_type *pmVar2;
  int *piVar3;
  reference ppVar4;
  pointer ppVar5;
  size_type sVar6;
  __enable_if_t<is_constructible<value_type,_pair<const_int,_deque<WriteMeta>_>_&>::value,_pair<iterator,_bool>_>
  _Var7;
  _Self local_128;
  _Self local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  undefined1 local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  WriteContentResult local_e4;
  iterator iStack_e0;
  WriteContentResult result;
  _Self local_d8;
  iterator index_1;
  _Self local_b0;
  _Self local_a8;
  iterator index;
  mapped_type c;
  ssize_t number;
  char *buffer;
  allocator<char> local_59;
  string local_58;
  _Self local_38;
  _Self local_30;
  int local_24;
  int local_20;
  int fd;
  int i;
  int epollRet;
  epoll_event *toHandleEvents;
  TcpServer *this_local;
  
  toHandleEvents = (epoll_event *)this;
  _i = (epoll_event *)operator_new__(0x3000);
  if (_i == (epoll_event *)0x0) {
    __assert_fail("toHandleEvents",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                  ,0x225,"void TcpServer::daemonRun()");
  }
  do {
    while( true ) {
      fd = -1;
      bVar1 = std::
              map<int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
              ::empty(&this->toWriteContents);
      if (bVar1) {
        fd = epoll_wait(this->epollFd,_i,0x400,-1);
      }
      else {
        fd = epoll_wait(this->epollFd,_i,0x400,0);
      }
      if (-1 < fd) break;
      recordError(this,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                  ,0x230);
      Logger::printLog(&logger,LOG_ERROR,&this->errorString,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                       ,0x231);
    }
    for (local_20 = 0; local_20 < fd; local_20 = local_20 + 1) {
      printEvent(this,*(int *)(&_i->field_0x4 + (long)local_20 * 0xc),
                 (&_i->events)[(long)local_20 * 3]);
      if (*(int *)(&_i->field_0x4 + (long)local_20 * 0xc) == this->serverFd) {
        if ((((&_i->events)[(long)local_20 * 3] & 1) != 0) &&
           (bVar1 = acceptNewConnection(this), !bVar1)) {
          recordError(this,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                      ,0x239);
          Logger::printLog(&logger,LOG_ERROR,&this->errorString,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                           ,0x23a);
        }
      }
      else if (*(int *)(&_i->field_0x4 + (long)local_20 * 0xc) == this->pipeFds[0]) {
        if (((&_i->events)[(long)local_20 * 3] & 1) != 0) {
          handleNotify(this);
        }
      }
      else {
        local_24 = *(int *)(&_i->field_0x4 + (long)local_20 * 0xc);
        local_30._M_node =
             (_Base_ptr)
             std::
             map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
             ::find(&this->connections,&local_24);
        local_38._M_node =
             (_Base_ptr)
             std::
             map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
             ::end(&this->connections);
        bVar1 = std::operator==(&local_30,&local_38);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"fd not seen before",&local_59);
          Logger::printLog(&logger,LOG_ERROR,&local_58,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                           ,0x246);
          std::__cxx11::string::~string((string *)&local_58);
          std::allocator<char>::~allocator(&local_59);
        }
        else if ((((&_i->events)[(long)local_20 * 3] & 1) == 0) &&
                (((&_i->events)[(long)local_20 * 3] & 0x10) == 0)) {
          if (((&_i->events)[(long)local_20 * 3] & 4) != 0) {
            local_a8._M_node =
                 (_Base_ptr)
                 std::
                 map<int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                 ::find(&this->inActiveWriteContents,&local_24);
            local_b0._M_node =
                 (_Base_ptr)
                 std::
                 map<int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                 ::end(&this->inActiveWriteContents);
            bVar1 = std::operator!=(&local_a8,&local_b0);
            if (bVar1) {
              ppVar4 = std::
                       _Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>
                       ::operator*(&local_a8);
              std::
              map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
              ::insert<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>&>
                        ((map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                          *)&this->toWriteContents,ppVar4);
              index_1 = std::
                        map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                        ::erase_abi_cxx11_((map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                                            *)&this->inActiveWriteContents,local_a8._M_node);
              pmVar2 = std::
                       map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                       ::operator[](&this->connections,&local_24);
              std::function<void_(const_TcpConnection_*,_void_*)>::operator()
                        (&this->onCanWriteHandler,pmVar2,this->data);
            }
          }
        }
        else {
          __args_1 = (char *)operator_new__(0x14000);
          if (__args_1 == (char *)0x0) {
            __assert_fail("buffer",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                          ,0x24d,"void TcpServer::daemonRun()");
          }
          while (__args_2 = read(local_24,__args_1,0x14000), 0 < (long)__args_2) {
            bVar1 = std::function::operator_cast_to_bool((function *)&this->onReadHandler);
            if (bVar1) {
              pmVar2 = std::
                       map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                       ::operator[](&this->connections,&local_24);
              index._M_node = *(_Base_ptr *)pmVar2;
              pmVar2 = std::
                       map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                       ::operator[](&this->connections,&local_24);
              std::function<void_(const_TcpConnection_*,_const_char_*,_unsigned_long,_void_*)>::
              operator()(&this->onReadHandler,pmVar2,__args_1,__args_2,this->data);
            }
          }
          if ((long)__args_2 < 0) {
            piVar3 = __errno_location();
            if (*piVar3 != 0xb) {
              recordError(this,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                          ,600);
              Logger::printLog(&logger,LOG_ERROR,&this->errorString,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                               ,0x259);
            }
          }
          else if (__args_2 == 0) {
            bVar1 = std::function::operator_cast_to_bool((function *)&this->onPeerShutdownHandler);
            if (bVar1) {
              pmVar2 = std::
                       map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                       ::operator[](&this->connections,&local_24);
              std::function<void_(const_TcpConnection_*,_void_*)>::operator()
                        (&this->onPeerShutdownHandler,pmVar2,this->data);
            }
            std::
            map<int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
            ::erase(&this->toWriteContents,&local_24);
            std::
            map<int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
            ::erase(&this->inActiveWriteContents,&local_24);
          }
          if (__args_1 != (char *)0x0) {
            operator_delete__(__args_1);
          }
        }
      }
    }
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
         ::begin(&this->toWriteContents);
    while( true ) {
      iStack_e0 = std::
                  map<int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                  ::end(&this->toWriteContents);
      bVar1 = std::operator!=(&local_d8,&stack0xffffffffffffff20);
      if (!bVar1) break;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>
               ::operator->(&local_d8);
      local_e4 = writeContent(this,ppVar5->first);
      if (local_e4 == DeleteConnection) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>
                 ::operator->(&local_d8);
        closeConnection(this,ppVar5->first);
        local_f8 = local_d8._M_node;
        local_f0 = (_Base_ptr)
                   std::
                   map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                   ::erase_abi_cxx11_((map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                                       *)&this->toWriteContents,local_d8._M_node);
        local_d8._M_node = local_f0;
      }
      else if (local_e4 == Move_to_Inactive) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>
                 ::operator*(&local_d8);
        _Var7 = std::
                map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                ::insert<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>&>
                          ((map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                            *)&this->inActiveWriteContents,ppVar4);
        local_108 = (_Base_ptr)_Var7.first._M_node;
        local_100 = _Var7.second;
        local_118 = local_d8._M_node;
        local_110 = (_Base_ptr)
                    std::
                    map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                    ::erase_abi_cxx11_((map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                                        *)&this->toWriteContents,local_d8._M_node);
        local_d8._M_node = local_110;
      }
      else if (local_e4 == OK) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>
                 ::operator->(&local_d8);
        local_120._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::find
                       (&this->closeWhenWriteFinish,&ppVar5->first);
        local_128._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::cend(&this->closeWhenWriteFinish);
        bVar1 = std::operator==(&local_120,&local_128);
        if ((bVar1) &&
           (bVar1 = std::function::operator_cast_to_bool((function *)&this->onCanWriteHandler),
           bVar1)) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>
                   ::operator->(&local_d8);
          pmVar2 = std::
                   map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                   ::operator[](&this->connections,&ppVar5->first);
          std::function<void_(const_TcpConnection_*,_void_*)>::operator()
                    (&this->onCanWriteHandler,pmVar2,this->data);
        }
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>
                 ::operator->(&local_d8);
        sVar6 = std::deque<WriteMeta,_std::allocator<WriteMeta>_>::size(&ppVar5->second);
        if (sVar6 == 0) {
          local_d8._M_node =
               (_Base_ptr)
               std::
               map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
               ::erase_abi_cxx11_((map<int,std::deque<WriteMeta,std::allocator<WriteMeta>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                                   *)&this->toWriteContents,local_d8._M_node);
        }
        else {
          std::
          _Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>
          ::operator++(&local_d8);
        }
      }
    }
  } while( true );
}

Assistant:

void daemonRun() {
    struct epoll_event *toHandleEvents;
    toHandleEvents = new struct epoll_event[1024];
    assert(toHandleEvents);
    for (;;) {
      int epollRet = -1;
      if (toWriteContents.empty()) {
        // 没有需要写的，阻塞等待
        epollRet = epoll_wait(epollFd, toHandleEvents, 1024, -1);
      } else {
        epollRet = epoll_wait(epollFd, toHandleEvents, 1024,
                              0);  // 立刻返回，用于write
      }
      if (epollRet < 0) {
        recordError(__FILE__, __LINE__);
        Log(logger, Logger::LOG_ERROR, errorString);
      } else {
        for (int i = 0; i < epollRet; ++i) {
          printEvent(toHandleEvents[i].data.fd, toHandleEvents[i].events);
          // 监听的serverFd
          if (toHandleEvents[i].data.fd == serverFd) {
            if (toHandleEvents[i].events & EPOLLIN) {
              if (!acceptNewConnection()) {
                recordError(__FILE__, __LINE__);
                Log(logger, Logger::LOG_ERROR, errorString);
              }
            }
          } else if (toHandleEvents[i].data.fd == pipeFds[0]) {
            // 调用者通知管道fd
            if (toHandleEvents[i].events & EPOLLIN) {
              handleNotify();
            }
          } else {
            // 处理客户端的连接
            int fd = toHandleEvents[i].data.fd;
            if (connections.find(fd) == connections.end()) {
              Log(logger, Logger::LOG_ERROR, "fd not seen before");
              continue;
            }
            if (toHandleEvents[i].events & EPOLLIN ||
                toHandleEvents[i].events & EPOLLHUP) {
              char *buffer = nullptr;
              buffer = new char[BUFFER_SIZE];
              assert(buffer);
              ssize_t number = -1;
              while ((number = read(fd, buffer, BUFFER_SIZE)) > 0) {
                if (onReadHandler) {
                  auto c = connections[fd];
                  onReadHandler(&(connections[fd]), buffer, number, data);
                }
              }
              if (number < 0) {
                if (errno == EAGAIN) {
                } else {
                  recordError(__FILE__, __LINE__);
                  Log(logger, Logger::LOG_ERROR, errorString);
                }
              } else if (number == 0) {
                // 对端关闭了连接，通知调用者
                // closeConnection(fd);
                if (onPeerShutdownHandler) {
                  onPeerShutdownHandler(&(connections[fd]), data);
                }
                // 删除write队列中的数据
                toWriteContents.erase(fd);
                inActiveWriteContents.erase(fd);
              }
              delete[] buffer;
            } else if (toHandleEvents[i].events & EPOLLOUT) {
              auto index = inActiveWriteContents.find(fd);
              if (index != inActiveWriteContents.end()) {
                toWriteContents.insert(*index);
                inActiveWriteContents.erase(index);
                onCanWriteHandler(&connections[fd], data);
              }
            }
          }
        }
        // 处理write
        for (auto index = toWriteContents.begin();
             index != toWriteContents.end();) {
          WriteContentResult result = writeContent(index->first);
          if (result == WriteContentResult::DeleteConnection) {
            // 关闭连接
            closeConnection(index->first);
            // 删除要写的数据
            index = toWriteContents.erase(index);
          } else if (result == WriteContentResult::Move_to_Inactive) {
            inActiveWriteContents.insert(*index);
            index = toWriteContents.erase(index);
          } else if (result == WriteContentResult::OK) {
            if (closeWhenWriteFinish.find(index->first) ==
                closeWhenWriteFinish.cend()) {
              if (onCanWriteHandler) {
                onCanWriteHandler(&(connections[index->first]), data);
              }
            }
            if (index->second.size() == 0) {
              index = toWriteContents.erase(index);
            } else {
              ++index;
            }
          }
        }
      }
    }
  }